

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SnippetFindPositions(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVal;
  char *pCsr;
  int local_2c;
  char *local_28;
  
  lVar5 = *(long *)((long)ctx + 0x18);
  *(int *)(lVar5 + (long)iPhrase * 0x30) = pExpr->pPhrase->nToken;
  iVar1 = sqlite3Fts3EvalPhrasePoslist(*ctx,pExpr,*(int *)((long)ctx + 8),&local_28);
  iVar3 = iVar1;
  if (local_28 != (char *)0x0) {
    lVar5 = lVar5 + (long)iPhrase * 0x30;
    *(char **)(lVar5 + 8) = local_28;
    if (*local_28 < '\0') {
      uVar2 = sqlite3Fts3GetVarint32(local_28,&local_2c);
      uVar4 = (ulong)uVar2;
    }
    else {
      uVar4 = 1;
      local_2c = (int)*local_28;
    }
    iVar3 = 0x10b;
    if (1 < local_2c) {
      *(char **)(lVar5 + 0x18) = local_28 + uVar4;
      *(char **)(lVar5 + 0x28) = local_28 + uVar4;
      *(int *)(lVar5 + 0x10) = local_2c + -2;
      *(int *)(lVar5 + 0x20) = local_2c + -2;
      iVar3 = iVar1;
    }
  }
  return iVar3;
}

Assistant:

static int fts3SnippetFindPositions(Fts3Expr *pExpr, int iPhrase, void *ctx){
  SnippetIter *p = (SnippetIter *)ctx;
  SnippetPhrase *pPhrase = &p->aPhrase[iPhrase];
  char *pCsr;
  int rc;

  pPhrase->nToken = pExpr->pPhrase->nToken;
  rc = sqlite3Fts3EvalPhrasePoslist(p->pCsr, pExpr, p->iCol, &pCsr);
  assert( rc==SQLITE_OK || pCsr==0 );
  if( pCsr ){
    int iFirst = 0;
    pPhrase->pList = pCsr;
    fts3GetDeltaPosition(&pCsr, &iFirst);
    if( iFirst<0 ){
      rc = FTS_CORRUPT_VTAB;
    }else{
      pPhrase->pHead = pCsr;
      pPhrase->pTail = pCsr;
      pPhrase->iHead = iFirst;
      pPhrase->iTail = iFirst;
    }
  }else{
    assert( rc!=SQLITE_OK || (
       pPhrase->pList==0 && pPhrase->pHead==0 && pPhrase->pTail==0 
    ));
  }

  return rc;
}